

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hmac.c
# Opt level: O2

bool_t beltHMACStepV(octet *mac,void *state)

{
  bool_t bVar1;
  
  beltHMACStepG_internal(state);
  bVar1 = memEq(mac,(void *)((long)state + 0xa0),0x20);
  return bVar1;
}

Assistant:

bool_t beltHMACStepV(const octet mac[32], void* state)
{
	belt_hmac_st* st = (belt_hmac_st*)state;
	ASSERT(memIsValid(mac, 32));
	beltHMACStepG_internal(state);
#if (OCTET_ORDER == BIG_ENDIAN)
	beltBlockRevU32(st->h1_out);
	beltBlockRevU32(st->h1_out + 4);
#endif
	return memEq(mac, st->h1_out, 32);
}